

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monkey.c
# Opt level: O0

void mk_server_info(mk_server *server)

{
  __pid_t _Var1;
  int iVar2;
  char local_88 [8];
  char tmp [64];
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_config_listener *l;
  mk_plugin *p;
  mk_list *head;
  mk_server *server_local;
  
  _Var1 = getpid();
  printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mProcess ID is %ld\n",(long)_Var1);
  for (p = (mk_plugin *)(server->listeners).next; p != (mk_plugin *)&server->listeners;
      p = (mk_plugin *)p->shortname) {
    printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mServer listening on %s:%s\n",
           p[-1].stage_list.next,*(undefined8 *)&p[-1].load_type);
  }
  printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0m%i threads, may handle up to %i client connections\n"
         ,(ulong)(uint)(int)server->workers,(ulong)server->server_capacity);
  printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mLoaded Plugins: ");
  for (p = (mk_plugin *)(server->plugins).next; p != (mk_plugin *)&server->plugins;
      p = (mk_plugin *)p->shortname) {
    tmp._56_8_ = &p[-1].init_plugin;
    printf("%s ",p[-1].exit_plugin);
  }
  printf("\n");
  iVar2 = mk_kernel_features_print(local_88,0x40,server);
  if (0 < iVar2) {
    printf("\x1b[1m[\x1b[92m+\x1b[0m\x1b[1m] \x1b[0mLinux Features: %s\n",local_88);
  }
  fflush(_stdout);
  return;
}

Assistant:

void mk_server_info(struct mk_server *server)
{
    struct mk_list *head;
    struct mk_plugin *p;
    struct mk_config_listener *l;

#ifdef _WIN32
    printf(MK_BANNER_ENTRY "Process ID is %ld\n", (long)GetCurrentProcessId());
#else
    printf(MK_BANNER_ENTRY "Process ID is %ld\n", (long) getpid());
#endif
    mk_list_foreach(head, &server->listeners) {
        l = mk_list_entry(head, struct mk_config_listener, _head);
        printf(MK_BANNER_ENTRY "Server listening on %s:%s\n",
               l->address, l->port);
    }
    printf(MK_BANNER_ENTRY
           "%i threads, may handle up to %i client connections\n",
           server->workers, server->server_capacity);

    /* List loaded plugins */
    printf(MK_BANNER_ENTRY "Loaded Plugins: ");
    mk_list_foreach(head, &server->plugins) {
        p = mk_list_entry(head, struct mk_plugin, _head);
        printf("%s ", p->shortname);
    }
    printf("\n");

#ifdef __linux__
    char tmp[64];

    if (mk_kernel_features_print(tmp, sizeof(tmp), server) > 0) {
        printf(MK_BANNER_ENTRY "Linux Features: %s\n", tmp);
    }
#endif

    fflush(stdout);
}